

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QList<QString>>>(QDataStream *s,QList<QList<QString>_> *c)

{
  Status SVar1;
  qint64 qVar2;
  QList<QList<QString>_> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  QDataStream *in_stack_ffffffffffffff88;
  StreamStateSaver *in_stack_ffffffffffffff90;
  long local_68;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  StreamStateSaver::StreamStateSaver(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QList<QList<QString>_>::clear((QList<QList<QString>_> *)in_stack_ffffffffffffff90);
  qVar2 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffff90);
  if (qVar2 < 0) {
    QDataStream::setStatus((Status)in_RDI);
  }
  else {
    QList<QList<QString>_>::reserve(in_RSI,asize);
    for (local_68 = 0; local_68 < qVar2; local_68 = local_68 + 1) {
      QList<QString>::QList((QList<QString> *)0xb1277a);
      ::operator>>((QDataStream *)in_stack_ffffffffffffff90,
                   (QList<QString> *)in_stack_ffffffffffffff88);
      SVar1 = QDataStream::status(in_RDI);
      if (SVar1 == Ok) {
        QList<QList<QString>_>::append
                  ((QList<QList<QString>_> *)in_stack_ffffffffffffff90,
                   (parameter_type)in_stack_ffffffffffffff88);
      }
      else {
        QList<QList<QString>_>::clear((QList<QList<QString>_> *)in_stack_ffffffffffffff90);
      }
      QList<QString>::~QList((QList<QString> *)0xb127cd);
      if (SVar1 != Ok) break;
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == asize) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}